

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

idx_t __thiscall duckdb::MetadataBlock::FreeBlocksToInteger(MetadataBlock *this)

{
  byte *pbVar1;
  ulong uVar2;
  idx_t i;
  ulong __n;
  
  uVar2 = 0;
  for (__n = 0; __n < (ulong)((long)(this->free_blocks).
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->free_blocks).
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start); __n = __n + 1) {
    pbVar1 = vector<unsigned_char,_true>::get<true>(&this->free_blocks,__n);
    uVar2 = uVar2 | 1L << ((ulong)*pbVar1 & 0x3f);
  }
  return uVar2;
}

Assistant:

idx_t MetadataBlock::FreeBlocksToInteger() {
	idx_t result = 0;
	for (idx_t i = 0; i < free_blocks.size(); i++) {
		D_ASSERT(free_blocks[i] < idx_t(64));
		idx_t mask = idx_t(1) << idx_t(free_blocks[i]);
		result |= mask;
	}
	return result;
}